

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O0

DdNode * selectMintermsFromUniverse(DdManager *manager,int *varSeen,double n)

{
  int iVar1;
  DdNode *T;
  DdNode **vars_00;
  DdNode *pDVar2;
  DdNode **vars;
  DdNode *result;
  DdNode *zero;
  DdNode *one;
  int j;
  int size;
  int i;
  int numVars;
  double n_local;
  int *varSeen_local;
  DdManager *manager_local;
  
  size = 0;
  iVar1 = manager->size;
  T = manager->one;
  j = iVar1;
  while (j = j + -1, -1 < j) {
    if (varSeen[j] == 0) {
      size = size + 1;
    }
  }
  vars_00 = (DdNode **)malloc((long)size << 3);
  if (vars_00 == (DdNode **)0x0) {
    manager->errorCode = CUDD_MEMORY_OUT;
    manager_local = (DdManager *)0x0;
  }
  else {
    one._0_4_ = 0;
    j = iVar1;
    while (j = j + -1, -1 < j) {
      if (varSeen[j] == 0) {
        pDVar2 = cuddUniqueInter(manager,manager->perm[j],T,(DdNode *)((ulong)T ^ 1));
        vars_00[(int)one] = pDVar2;
        *(int *)(((ulong)vars_00[(int)one] & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)vars_00[(int)one] & 0xfffffffffffffffe) + 4) + 1;
        one._0_4_ = (int)one + 1;
      }
    }
    manager_local = (DdManager *)mintermsFromUniverse(manager,vars_00,size,n,0);
    if (manager_local != (DdManager *)0x0) {
      *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) + 1;
    }
    for (j = 0; j < size; j = j + 1) {
      Cudd_RecursiveDeref(manager,vars_00[j]);
    }
    if (vars_00 != (DdNode **)0x0) {
      free(vars_00);
    }
  }
  return &manager_local->sentinel;
}

Assistant:

static DdNode *
selectMintermsFromUniverse(
  DdManager * manager,
  int * varSeen,
  double  n)
{
    int numVars;
    int i, size, j;
     DdNode *one, *zero, *result;
    DdNode **vars;

    numVars = 0;
    size = manager->size;
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Count the number of variables not encountered so far in procedure
    ** cuddSplitSetRecur.
    */
    for (i = size-1; i >= 0; i--) {
        if(varSeen[i] == 0)
            numVars++;
    }
    vars = ABC_ALLOC(DdNode *, numVars);
    if (!vars) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    j = 0;
    for (i = size-1; i >= 0; i--) {
        if(varSeen[i] == 0) {
            vars[j] = cuddUniqueInter(manager,manager->perm[i],one,zero);
            cuddRef(vars[j]);
            j++;
        }
    }

    /* Compute a function which has n minterms and depends on at most
    ** numVars variables.
    */
    result = mintermsFromUniverse(manager,vars,numVars,n, 0);
    if (result) 
        cuddRef(result);

    for (i = 0; i < numVars; i++)
        Cudd_RecursiveDeref(manager,vars[i]);
    ABC_FREE(vars);

    return(result);

}